

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::SpreadVolatileSemantics::VisitLoadsOfPointersToVariableInEntries
          (SpreadVolatileSemantics *this,uint32_t var_id,
          function<bool_(spvtools::opt::Instruction_*)> *handle_load,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *function_ids)

{
  uint32_t id;
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  DefUseManager *this_00;
  _func_void *p_Var4;
  uint32_t ptr_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> worklist;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  SpreadVolatileSemantics *local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_68;
  uint32_t *local_60;
  _Any_data local_58;
  code *local_48;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_38;
  
  local_70 = (SpreadVolatileSemantics *)CONCAT44(local_70._4_4_,var_id);
  worklist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  worklist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  worklist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&worklist,&local_70);
  this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  do {
    puVar2 = worklist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar1 = worklist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (worklist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        worklist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    id = worklist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish[-1];
    pvStack_68 = &worklist;
    local_60 = &ptr_id;
    ptr_id = id;
    worklist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         worklist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
    local_70 = this;
    std::function<bool_(spvtools::opt::Instruction_*)>::function
              ((function<bool_(spvtools::opt::Instruction_*)> *)&local_58,handle_load);
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_88 = (code *)0x0;
    pcStack_80 = (code *)0x0;
    local_38 = function_ids;
    p_Var4 = (_func_void *)::operator_new(0x40);
    *(SpreadVolatileSemantics **)p_Var4 = local_70;
    *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(p_Var4 + 8) = pvStack_68;
    *(uint32_t **)(p_Var4 + 0x10) = local_60;
    std::function<bool_(spvtools::opt::Instruction_*)>::function
              ((function<bool_(spvtools::opt::Instruction_*)> *)(p_Var4 + 0x18),
               (function<bool_(spvtools::opt::Instruction_*)> *)&local_58);
    *(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      **)(p_Var4 + 0x38) = local_38;
    pcStack_80 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/spread_volatile_semantics.cpp:213:17)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/spread_volatile_semantics.cpp:213:17)>
               ::_M_manager;
    local_98._M_unused._0_8_ = (undefined8)p_Var4;
    bVar3 = analysis::DefUseManager::WhileEachUser
                      (this_00,id,(function<bool_(spvtools::opt::Instruction_*)> *)&local_98);
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  } while (bVar3);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&worklist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return puVar1 == puVar2;
}

Assistant:

bool SpreadVolatileSemantics::VisitLoadsOfPointersToVariableInEntries(
    uint32_t var_id, const std::function<bool(Instruction*)>& handle_load,
    const std::unordered_set<uint32_t>& function_ids) {
  std::vector<uint32_t> worklist({var_id});
  auto* def_use_mgr = context()->get_def_use_mgr();
  while (!worklist.empty()) {
    uint32_t ptr_id = worklist.back();
    worklist.pop_back();
    bool finish_traversal = !def_use_mgr->WhileEachUser(
        ptr_id, [this, &worklist, &ptr_id, handle_load,
                 &function_ids](Instruction* user) {
          BasicBlock* block = context()->get_instr_block(user);
          if (block == nullptr ||
              function_ids.find(block->GetParent()->result_id()) ==
                  function_ids.end()) {
            return true;
          }

          if (user->opcode() == spv::Op::OpAccessChain ||
              user->opcode() == spv::Op::OpInBoundsAccessChain ||
              user->opcode() == spv::Op::OpPtrAccessChain ||
              user->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
              user->opcode() == spv::Op::OpCopyObject) {
            if (ptr_id == user->GetSingleWordInOperand(0))
              worklist.push_back(user->result_id());
            return true;
          }

          if (user->opcode() != spv::Op::OpLoad) {
            return true;
          }

          return handle_load(user);
        });
    if (finish_traversal) return false;
  }
  return true;
}